

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O2

void __thiscall cmGeneratedFileStream::cmGeneratedFileStream(cmGeneratedFileStream *this)

{
  std::ios::ios((ios *)&(this->super_ofstream).field_0x140);
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  std::ofstream::ofstream(this);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x5d5cb0;
  *(undefined8 *)&(this->super_ofstream).field_0x140 = 0x5d5cd8;
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream():
  cmGeneratedFileStreamBase(), Stream()
{
}